

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefAs
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,RefAs *curr)

{
  RefAsOp RVar1;
  HeapType local_38;
  Type local_30;
  HeapType local_28;
  Type local_20;
  RefAs *local_18;
  RefAs *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  RVar1 = curr->op;
  local_18 = curr;
  curr_local = (RefAs *)this;
  if (RVar1 == RefAsNonNull) {
    noteAnyReference(this,&curr->value);
  }
  else if (RVar1 == AnyConvertExtern) {
    HeapType::HeapType(&local_28,ext);
    wasm::Type::Type(&local_20,local_28,Nullable,Inexact);
    note(this,&curr->value,local_20);
  }
  else {
    if (RVar1 != ExternConvertAny) {
      handle_unreachable("unexpected op",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                         ,0x40f);
    }
    HeapType::HeapType(&local_38,any);
    wasm::Type::Type(&local_30,local_38,Nullable,Inexact);
    note(this,&curr->value,local_30);
  }
  return;
}

Assistant:

void visitRefAs(RefAs* curr) {
    switch (curr->op) {
      case RefAsNonNull:
        noteAnyReference(&curr->value);
        return;
      case AnyConvertExtern:
        note(&curr->value, Type(HeapType::ext, Nullable));
        return;
      case ExternConvertAny:
        note(&curr->value, Type(HeapType::any, Nullable));
        return;
    }
    WASM_UNREACHABLE("unexpected op");
  }